

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O3

_Bool build_simple(chunk *c,loc_conflict centre,wchar_t rating)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  wchar_t y2;
  wchar_t wVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  loc lVar9;
  square *psVar10;
  int iVar11;
  int iVar12;
  wchar_t x1;
  uint uVar13;
  wchar_t x1_00;
  wchar_t wVar14;
  wchar_t y1;
  wchar_t wVar15;
  wchar_t x2;
  wchar_t wVar16;
  loc_conflict centre_local;
  
  centre_local = centre;
  uVar2 = Rand_div(4);
  uVar3 = Rand_div(3);
  uVar4 = Rand_div(0xb);
  uVar5 = Rand_div(0xb);
  wVar15 = uVar3 + uVar2 + L'\x05';
  wVar14 = uVar5 + 5 + uVar4;
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,wVar15,wVar14);
  if ((c->height <= centre.y) || (wVar16 = centre.y, c->width <= centre.x)) {
    _Var1 = find_space(&centre_local,wVar15,wVar14);
    if (!_Var1) {
      return false;
    }
    centre = (loc_conflict)((ulong)centre_local & 0xffffffff);
    wVar16 = centre_local.y;
  }
  iVar11 = uVar2 + uVar3 + 3;
  iVar12 = uVar4 + uVar5 + 3;
  wVar16 = wVar16 - iVar11 / 2;
  x1_00 = centre.x - iVar12 / 2;
  wVar15 = wVar16 + iVar11;
  y2 = wVar16 + iVar11 + L'\xffffffff';
  x2 = x1_00 + iVar12;
  wVar6 = x1_00 + L'\xffffffff' + iVar12;
  wVar14 = c->depth;
  uVar7 = Rand_div(0x19);
  y1 = wVar16 + L'\xffffffff';
  x1 = x1_00 + L'\xffffffff';
  generate_room(c,y1,x1,wVar15,x2,(uint)(wVar14 <= uVar7 + L'\x01'));
  draw_rectangle(c,y1,x1,wVar15,x2,FEAT_GRANITE,L'\f',false);
  fill_rectangle(c,wVar16,x1_00,y2,wVar6,FEAT_FLOOR,L'\0');
  uVar7 = Rand_div(0x14);
  if (uVar7 == 0) {
    uVar2 = 0;
    uVar13 = wVar6 - x1_00;
    if ((uVar13 & 1) != 0) {
      uVar2 = Rand_div(2);
    }
    uVar3 = 0;
    if ((y2 - wVar16 & 1U) != 0) {
      uVar3 = Rand_div(2);
    }
    event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"pillared");
    if ((int)uVar3 < iVar11) {
      wVar14 = wVar16 + uVar3;
      do {
        wVar6 = x1_00 + uVar2;
        if ((int)uVar2 < iVar12) {
          do {
            lVar9 = (loc)loc(wVar6,wVar14);
            square_set_feat((chunk_conflict *)c,lVar9,FEAT_GRANITE);
            generate_mark(c,lVar9.y,lVar9.x,lVar9.y,lVar9.x,L'\v');
            wVar6 = wVar6 + L'\x02';
          } while (wVar6 < x2);
        }
        wVar14 = wVar14 + L'\x02';
      } while (wVar14 < wVar15);
    }
    if (uVar3 == 0) {
      if (uVar2 == 0) {
        lVar9 = (loc)loc(x1,y1);
        psVar10 = square((chunk_conflict *)c,lVar9);
        flag_off(psVar10->info,3,4);
        lVar9 = (loc)loc(x1,y1);
        psVar10 = square((chunk_conflict *)c,lVar9);
        flag_off(psVar10->info,3,0xc);
      }
      if ((uVar13 - uVar2 & 1) == 0) {
        lVar9 = (loc)loc(x2,y1);
        psVar10 = square((chunk_conflict *)c,lVar9);
        flag_off(psVar10->info,3,4);
        lVar9 = (loc)loc(x2,y1);
        psVar10 = square((chunk_conflict *)c,lVar9);
        flag_off(psVar10->info,3,0xc);
      }
    }
    if (((y2 - wVar16) - uVar3 & 1U) == 0) {
      if (uVar2 == 0) {
        lVar9 = (loc)loc(x1,wVar15);
        psVar10 = square((chunk_conflict *)c,lVar9);
        flag_off(psVar10->info,3,4);
        lVar9 = (loc)loc(x1,wVar15);
        psVar10 = square((chunk_conflict *)c,lVar9);
        flag_off(psVar10->info,3,0xc);
      }
      if ((uVar13 - uVar2 & 1) == 0) {
        lVar9 = (loc)loc(x2,wVar15);
        psVar10 = square((chunk_conflict *)c,lVar9);
        flag_off(psVar10->info,3,4);
        lVar9 = (loc)loc(x2,wVar15);
        psVar10 = square((chunk_conflict *)c,lVar9);
        flag_off(psVar10->info,3,0xc);
      }
    }
  }
  else {
    uVar7 = Rand_div(0x32);
    if (uVar7 == 0) {
      uVar8 = 0;
      uVar7 = 0;
      if ((wVar6 - x1_00 & 1U) != 0) {
        uVar7 = Rand_div(2);
      }
      if ((y2 - wVar16 & 1U) != 0) {
        uVar8 = Rand_div(2);
      }
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"ragged");
      iVar11 = uVar8 + wVar16;
      while (iVar11 = iVar11 + 2, iVar11 <= uVar3 + uVar2 + wVar16) {
        lVar9 = (loc)loc(x1_00,iVar11);
        square_set_feat((chunk_conflict *)c,lVar9,FEAT_GRANITE);
        generate_mark(c,lVar9.y,lVar9.x,lVar9.y,lVar9.x,L'\v');
        lVar9 = (loc)loc(wVar6,iVar11);
        square_set_feat((chunk_conflict *)c,lVar9,FEAT_GRANITE);
        generate_mark(c,lVar9.y,lVar9.x,lVar9.y,lVar9.x,L'\v');
      }
      iVar11 = x1_00 + uVar7;
      while (iVar11 = iVar11 + 2, iVar11 <= uVar5 + uVar4 + x1_00) {
        lVar9 = (loc)loc(iVar11,wVar16);
        square_set_feat((chunk_conflict *)c,lVar9,FEAT_GRANITE);
        generate_mark(c,lVar9.y,lVar9.x,lVar9.y,lVar9.x,L'\v');
        lVar9 = (loc)loc(iVar11,y2);
        square_set_feat((chunk_conflict *)c,lVar9,FEAT_GRANITE);
        generate_mark(c,lVar9.y,lVar9.x,lVar9.y,lVar9.x,L'\v');
      }
    }
  }
  return true;
}

Assistant:

bool build_simple(struct chunk *c, struct loc centre, int rating)
{
	int y, x, y1, x1, y2, x2;
	int light = false;

	/* Pick a room size */
	int height = 1 + randint1(4) + randint1(3);
	int width = 1 + randint1(11) + randint1(11);

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height + 2, width + 2);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, height + 2, width + 2))
			return (false);
	}

	/* Set bounds */
	y1 = centre.y - height / 2;
	x1 = centre.x - width / 2;
	y2 = y1 + height - 1;
	x2 = x1 + width - 1;

	/* Occasional light */
	if (c->depth <= randint1(25)) light = true;

	/* Generate new room */
	generate_room(c, y1-1, x1-1, y2+1, x2+1, light);

	/* Generate outer walls and inner floors */
	draw_rectangle(c, y1-1, x1-1, y2+1, x2+1, FEAT_GRANITE,
		SQUARE_WALL_OUTER, false);
	fill_rectangle(c, y1, x1, y2, x2, FEAT_FLOOR, SQUARE_NONE);

	if (one_in_(20)) {
		/*
		 * Sometimes make a pillar room.
		 * If a dimension is even, don't always put a pillar in the
		 * upper left corner.
		 */
		int offx = ((x2 - x1) % 2 == 0) ? 0 : randint0(2);
		int offy = ((y2 - y1) % 2 == 0) ? 0 : randint0(2);

		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "pillared");

		for (y = y1 + offy; y <= y2; y += 2)
			for (x = x1 + offx; x <= x2; x += 2)
				set_marked_granite(c, loc(x, y), SQUARE_WALL_INNER);
		/*
		 * Drop room/outer wall flags on corners if not adjacent to a
		 * floor.  Lets tunnels enter those grids.
		 */
		if (!offy) {
			if (!offx) {
				sqinfo_off(square(c, loc(x1 - 1, y1 - 1))->info,
					SQUARE_ROOM);
				sqinfo_off(square(c, loc(x1 - 1, y1 - 1))->info,
					SQUARE_WALL_OUTER);
			}
			if ((x2 - x1 - offx) % 2 == 0) {
				sqinfo_off(square(c, loc(x2 + 1, y1 - 1))->info,
					SQUARE_ROOM);
				sqinfo_off(square(c, loc(x2 + 1, y1 - 1))->info,
					SQUARE_WALL_OUTER);
			}
		}
		if ((y2 - y1 - offy) % 2 == 0) {
			if (!offx) {
				sqinfo_off(square(c, loc(x1 - 1, y2 + 1))->info,
					SQUARE_ROOM);
				sqinfo_off(square(c, loc(x1 - 1, y2 + 1))->info,
					SQUARE_WALL_OUTER);
			}
			if ((x2 - x1 - offx) % 2 == 0) {
				sqinfo_off(square(c, loc(x2 + 1, y2 + 1))->info,
					SQUARE_ROOM);
				sqinfo_off(square(c, loc(x2 + 1, y2 + 1))->info,
					SQUARE_WALL_OUTER);
			}
		}
	} else if (one_in_(50)) {
		/*
		 * Sometimes make a ragged-edge room.
		 * If a dimension is even, don't always put the first
		 * indentations at (x1, y1 + 2) and (x1 + 2, y1).
		 */
		int offx = ((x2 - x1) % 2 == 0) ? 0 : randint0(2);
		int offy = ((y2 - y1) % 2 == 0) ? 0 : randint0(2);

		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "ragged");

		for (y = y1 + 2 + offy; y <= y2 - 2; y += 2) {
			set_marked_granite(c, loc(x1, y), SQUARE_WALL_INNER);
			set_marked_granite(c, loc(x2, y), SQUARE_WALL_INNER);
		}

		for (x = x1 + 2 + offx; x <= x2 - 2; x += 2) {
			set_marked_granite(c, loc(x, y1), SQUARE_WALL_INNER);
			set_marked_granite(c, loc(x, y2), SQUARE_WALL_INNER);
		}
	}
	return true;
}